

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O2

bool pvmath::haarTransform<float>(void)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  int iVar4;
  ulong __n;
  uint uVar5;
  size_t id_1;
  long lVar6;
  uint uVar7;
  size_t id;
  ulong uVar8;
  undefined1 auVar9 [16];
  allocator_type local_85;
  uint32_t local_84;
  vector<float,_std::allocator<float>_> input;
  vector<float,_std::allocator<float>_> inverse;
  vector<float,_std::allocator<float>_> direct;
  
  uVar5 = 0;
  do {
    local_84 = Test_Helper::runCount();
    if (local_84 <= uVar5) {
LAB_0017cd22:
      return local_84 <= uVar5;
    }
    uVar3 = rand();
    uVar7 = uVar3 & 0xff;
    if ((uVar3 & 0xff) < 0x11) {
      uVar7 = 0x10;
    }
    uVar7 = uVar7 * 2;
    uVar3 = rand();
    uVar3 = uVar3 & 0xff;
    if (uVar3 < 0x11) {
      uVar3 = 0x10;
    }
    uVar3 = uVar3 * 2;
    __n = (ulong)(uVar3 * uVar7);
    std::vector<float,_std::allocator<float>_>::vector(&input,__n,(allocator_type *)&direct);
    std::vector<float,_std::allocator<float>_>::vector(&direct,__n,(allocator_type *)&inverse);
    for (uVar8 = 0;
        uVar8 < (ulong)((long)input.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)input.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); uVar8 = uVar8 + 1) {
      iVar4 = rand();
      input.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8] = (float)(iVar4 % 0xff);
      iVar4 = rand();
      direct.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar8] = (float)(iVar4 % 0xff);
    }
    std::vector<float,_std::allocator<float>_>::vector(&inverse,__n,&local_85);
    Image_Function::HaarDirectTransform
              ((vector<float,_std::allocator<float>_> *)
               &input.super__Vector_base<float,_std::allocator<float>_>,
               (vector<float,_std::allocator<float>_> *)
               &direct.super__Vector_base<float,_std::allocator<float>_>,(ulong)uVar7,(ulong)uVar3);
    Image_Function::HaarInverseTransform
              ((vector<float,_std::allocator<float>_> *)
               &direct.super__Vector_base<float,_std::allocator<float>_>,&inverse,(ulong)uVar7,
               (ulong)uVar3);
    lVar6 = 0;
    while ((long)input.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)input.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2 != lVar6) {
      pfVar1 = input.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + lVar6;
      pfVar2 = inverse.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + lVar6;
      lVar6 = lVar6 + 1;
      auVar9._8_4_ = 0x7fffffff;
      auVar9._0_8_ = 0x7fffffff7fffffff;
      auVar9._12_4_ = 0x7fffffff;
      auVar9 = vandps_avx512vl(ZEXT416((uint)(*pfVar1 - *pfVar2)),auVar9);
      if (0.001 < auVar9._0_4_) {
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&inverse.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&direct.super__Vector_base<float,_std::allocator<float>_>);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&input.super__Vector_base<float,_std::allocator<float>_>);
        goto LAB_0017cd22;
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&inverse.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&direct.super__Vector_base<float,_std::allocator<float>_>);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&input.super__Vector_base<float,_std::allocator<float>_>);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool haarTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const uint32_t width  = Unit_Test::randomValue<uint32_t>( 16u, 256u ) * 2; // to make sure that number is divided by 2
            const uint32_t height = Unit_Test::randomValue<uint32_t>( 16u, 256u ) * 2;
            std::vector< _Type > input ( width * height );
            std::vector< _Type > direct( width * height );

            for ( size_t id = 0; id < input.size(); ++id ) {
                input [id] = Unit_Test::randomFloatValue<_Type>( 0, 255, 1.0f );
                direct[id] = Unit_Test::randomFloatValue<_Type>( 0, 255, 1.0f );
            }

            std::vector< _Type > inverse ( width * height );
            Image_Function::HaarDirectTransform ( input, direct, width, height );
            Image_Function::HaarInverseTransform( direct, inverse, width, height );

            for ( size_t id = 0; id < input.size(); ++id ) {
                if (std::fabs(input[id] - inverse[id]) > 0.001f)
                    return false;
            }
        }

        return true;
    }